

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

void end_scope(LinearizerState *linearizer,Proc *proc,uint line_number)

{
  Scope *scope;
  Pseudo *pseudo;
  byte bVar1;
  LuaSymbol *pLVar2;
  uint uVar3;
  uint uVar4;
  PtrListIterator symiter__;
  PtrListIterator local_30;
  
  scope = (Scope *)(linearizer->C_declarations).pos;
  if ((scope->field_0x18 & 1) != 0) {
    instruct_close((Proc *)linearizer,(BasicBlock *)linearizer[1].compiler_state,scope,(uint)proc);
  }
  raviX_ptrlist_reverse_iterator(&local_30,(PtrList *)scope->symbol_list);
  pLVar2 = (LuaSymbol *)raviX_ptrlist_iter_prev(&local_30);
  if (pLVar2 != (LuaSymbol *)0x0) {
    do {
      if (pLVar2->symbol_type == SYM_LOCAL) {
        pseudo = (pLVar2->field_1).variable.pseudo;
        uVar4 = *(uint *)pseudo & 0xf;
        if (uVar4 - 1 < 3) {
          if (pLVar2 != (pseudo->field_3).symbol) {
            __assert_fail("sym == pseudo->temp_for_local",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0xbd5,"void end_scope(LinearizerState *, Proc *, unsigned int)");
          }
          free_temp_pseudo((Proc *)linearizer,pseudo,true);
        }
        else {
          if (uVar4 != 0) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0xbd9,"void end_scope(LinearizerState *, Proc *, unsigned int)");
          }
          if ((pseudo->field_3).symbol != pLVar2) {
            __assert_fail("pseudo && pseudo->type == PSEUDO_SYMBOL && pseudo->symbol == sym",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0xbd1,"void end_scope(LinearizerState *, Proc *, unsigned int)");
          }
          uVar3 = *(uint *)pseudo >> 4;
          uVar4 = uVar3 & 0xffff;
          if (0xff < uVar4) {
            __assert_fail("reg < MAXBIT",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                          ,0x86,"void pseudo_gen_free(PseudoGenerator *, unsigned int)");
          }
          bVar1 = (byte)uVar3 & 0x3f;
          (&linearizer[1].current_proc)[uVar4 >> 6] =
               (Proc *)((ulong)(&linearizer[1].current_proc)[uVar4 >> 6] &
                       (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1));
        }
      }
      pLVar2 = (LuaSymbol *)raviX_ptrlist_iter_prev(&local_30);
    } while (pLVar2 != (LuaSymbol *)0x0);
  }
  (linearizer->C_declarations).pos = (size_t)scope->parent;
  return;
}

Assistant:

static void end_scope(LinearizerState *linearizer, Proc *proc, unsigned line_number)
{
	Scope *scope = proc->current_scope;
	LuaSymbol *sym;
	if (scope->need_close) {
		instruct_close(proc, proc->current_bb, scope, line_number);
	}
	FOR_EACH_PTR_REVERSE(scope->symbol_list, LuaSymbol, sym)
	{
		if (sym->symbol_type == SYM_LOCAL) {
			Pseudo *pseudo = sym->variable.pseudo;
			if (pseudo->type == PSEUDO_SYMBOL) {
				assert(pseudo && pseudo->type == PSEUDO_SYMBOL && pseudo->symbol == sym);
				free_register(proc, &proc->local_pseudos, pseudo->regnum);
			}
			else if (pseudo->type == PSEUDO_TEMP_INT || pseudo->type == PSEUDO_TEMP_FLT || pseudo->type == PSEUDO_TEMP_BOOL) {
				assert(sym == pseudo->temp_for_local);
				free_temp_pseudo(proc, sym->variable.pseudo, true);
			}
			else {
				assert(false);
			}
		}
	}
	END_FOR_EACH_PTR_REVERSE(sym)
	proc->current_scope = scope->parent;
}